

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

void Gia_ManCorrReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  
  pGVar3 = p->pObjs;
  if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar2 = (ulong)(uint)p->pReprs[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555] &
          0xfffffff;
  if (uVar2 == 0xfffffff) {
    pGVar3 = (Gia_Obj_t *)0x0;
  }
  else {
    if (p->nObjs <= (int)uVar2) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar3 = pGVar3 + uVar2;
  }
  if (pGVar3 == (Gia_Obj_t *)0x0) {
    if (pObj->Value != 0xffffffff) {
      return;
    }
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar1 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar1 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                    ,0x2a1,"void Gia_ManCorrReduce_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManCorrReduce_rec(pNew,p,pObj + -(ulong)uVar1);
    Gia_ManCorrReduce_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    uVar2 = *(ulong *)pObj;
    if (-1 < (int)pObj[-(uVar2 & 0x1fffffff)].Value) {
      uVar1 = (uint)(uVar2 >> 0x20);
      if (-1 < (int)pObj[-(ulong)(uVar1 & 0x1fffffff)].Value) {
        uVar1 = Gia_ManHashAnd(pNew,(uint)(uVar2 >> 0x1d) & 1 ^ pObj[-(uVar2 & 0x1fffffff)].Value,
                               pObj[-(ulong)(uVar1 & 0x1fffffff)].Value ^ uVar1 >> 0x1d & 1);
        goto LAB_005c8615;
      }
    }
  }
  else {
    Gia_ManCorrReduce_rec(pNew,p,pGVar3);
    if (-1 < (int)pGVar3->Value) {
      uVar1 = pGVar3->Value ^
              (uint)(((uint)((ulong)*(undefined8 *)((ulong)pGVar3 & 0xfffffffffffffffe) >> 0x3f) ^
                     (uint)pGVar3 & 1) !=
                    ((uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f) ^
                    (uint)pObj & 1));
LAB_005c8615:
      pObj->Value = uVar1;
      return;
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf5,"int Abc_LitNotCond(int, int)");
}

Assistant:

void Gia_ManCorrReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr;
    if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        Gia_ManCorrReduce_rec( pNew, p, pRepr );
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
        return;
    }
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManCorrReduce_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManCorrReduce_rec( pNew, p, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}